

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<vector_brodnik<unsigned_char*>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_brodnik<unsigned_char_*> *buckets)

{
  vector_brodnik<unsigned_char_*> *pvVar1;
  ushort uVar2;
  uchar *puVar3;
  int iVar4;
  uint j;
  long lVar5;
  size_t sVar6;
  uchar *puVar7;
  uint8_t *puVar8;
  pointer pppuVar9;
  uchar **ppuVar10;
  long lVar11;
  pointer pppuVar12;
  size_t __n;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uchar **ppuVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  uint i;
  size_t sVar20;
  uint j_1;
  long lVar21;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar10 = strings;
      do {
        puVar7 = ppuVar10[1];
        ppuVar10 = ppuVar10 + 1;
        for (ppuVar16 = ppuVar10; strings < ppuVar16; ppuVar16 = ppuVar16 + -1) {
          puVar3 = ppuVar16[-1];
          bVar18 = puVar3[depth];
          bVar19 = puVar7[depth];
          if ((bVar18 != 0) && (lVar5 = depth + 1, bVar18 == bVar19)) {
            do {
              bVar18 = puVar3[lVar5];
              bVar19 = puVar7[lVar5];
              if (bVar18 == 0) break;
              lVar5 = lVar5 + 1;
            } while (bVar18 == bVar19);
          }
          if (bVar18 <= bVar19) break;
          *ppuVar16 = puVar3;
        }
        iVar4 = (int)n;
        *ppuVar16 = puVar7;
        n = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      sVar20 = 0;
    }
    else {
      sVar20 = 0;
      ppuVar10 = strings;
      do {
        lVar5 = 0;
        do {
          *(uchar *)((long)local_238 + lVar5) = ppuVar10[lVar5][depth];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        lVar5 = 0;
        do {
          pvVar1 = buckets + *(byte *)((long)local_238 + lVar5);
          sVar6 = buckets[*(byte *)((long)local_238 + lVar5)]._left_in_block;
          if (sVar6 == 0) {
            vector_brodnik<unsigned_char_*>::grow(pvVar1);
            sVar6 = pvVar1->_left_in_block;
          }
          puVar7 = ppuVar10[lVar5];
          ppuVar16 = pvVar1->_insertpos;
          pvVar1->_insertpos = ppuVar16 + 1;
          *ppuVar16 = puVar7;
          pvVar1->_left_in_block = sVar6 - 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        sVar20 = sVar20 + 0x20;
        ppuVar10 = ppuVar10 + 0x20;
      } while (sVar20 < (n & 0xffffffffffffffe0));
    }
    if (sVar20 < n) {
      do {
        puVar7 = strings[sVar20];
        pvVar1 = buckets + puVar7[depth];
        sVar6 = buckets[puVar7[depth]]._left_in_block;
        if (sVar6 == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar1);
          sVar6 = pvVar1->_left_in_block;
          puVar7 = strings[sVar20];
        }
        ppuVar10 = pvVar1->_insertpos;
        pvVar1->_insertpos = ppuVar10 + 1;
        *ppuVar10 = puVar7;
        pvVar1->_left_in_block = sVar6 - 1;
        sVar20 = sVar20 + 1;
      } while (n != sVar20);
    }
    puVar8 = &buckets->_superblock;
    lVar5 = 0;
    do {
      local_238[lVar5] =
           ((short)(2L << (*puVar8 & 0x3f)) -
           ((short)(int)*(size_t *)(puVar8 + -0xc) * (short)*(undefined4 *)(puVar8 + -4) +
           (short)(int)*(size_t *)(puVar8 + -0x14))) - 0x40;
      lVar5 = lVar5 + 1;
      puVar8 = puVar8 + 0x38;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    lVar11 = 0;
    do {
      uVar2 = local_238[lVar5];
      if ((ulong)uVar2 != 0) {
        pvVar1 = buckets + lVar5;
        ppuVar10 = strings + lVar11;
        pppuVar12 = buckets[lVar5]._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pppuVar9 = buckets[lVar5]._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (pppuVar9 != pppuVar12) {
          lVar15 = 8;
          uVar14 = 0;
          lVar17 = 8;
          bVar18 = 0;
          do {
            if (lVar17 != 0) {
              uVar13 = uVar14;
              lVar21 = lVar17;
              do {
                pppuVar12 = (pvVar1->_index_block).
                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pppuVar9 = (pvVar1->_index_block).
                           super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                if (uVar13 == ((long)pppuVar9 - (long)pppuVar12 >> 3) - 1U) goto LAB_001a48db;
                if (lVar15 != 0) {
                  memmove(ppuVar10,pppuVar12[uVar13],lVar15 * 8);
                }
                uVar13 = uVar13 + 1;
                ppuVar10 = ppuVar10 + lVar15;
                lVar21 = lVar21 + -1;
              } while (lVar21 != 0);
              pppuVar12 = (pvVar1->_index_block).
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              pppuVar9 = (pvVar1->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar14 = uVar14 + lVar17;
            lVar17 = lVar17 << bVar18;
            bVar18 = bVar18 ^ 1;
            lVar15 = lVar15 << bVar18;
          } while (uVar14 < (ulong)((long)pppuVar9 - (long)pppuVar12 >> 3));
        }
LAB_001a48db:
        __n = (long)pvVar1->_insertpos - (long)pppuVar9[-1];
        if (__n != 0) {
          memmove(ppuVar10,pppuVar9[-1],__n);
        }
        lVar11 = lVar11 + (ulong)uVar2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    do {
      vector_brodnik<unsigned_char_*>::clear
                ((vector_brodnik<unsigned_char_*> *)
                 ((long)&(buckets->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + 0x38;
    } while (lVar5 != 0x3800);
    uVar14 = (ulong)local_238[0];
    lVar5 = 1;
    do {
      uVar13 = (ulong)local_238[lVar5];
      if (uVar13 != 0) {
        msd_D<vector_brodnik<unsigned_char*>,unsigned_short>
                  (strings + uVar14,uVar13,depth + 1,buckets);
        uVar14 = uVar14 + uVar13;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}